

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

void __thiscall cmCTestTestHandler::GenerateDartOutput(cmCTestTestHandler *this,cmXMLWriter *xml)

{
  pointer pcVar1;
  char *pcVar2;
  cmCTestTestResult *result;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  cmCTestTestHandler *pcVar5;
  pointer pcVar6;
  string testPath;
  string local_b8;
  allocator<char> local_91;
  cmCTestTestHandler *local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  pointer local_68;
  cmCTestTestResult *local_60;
  _Rb_tree_node_base *local_58;
  string local_50;
  
  bVar3 = cmCTest::GetProduceXML((this->super_cmCTestGenericHandler).CTest);
  if (bVar3) {
    cmCTest::StartXML((this->super_cmCTestGenericHandler).CTest,xml,
                      (this->super_cmCTestGenericHandler).AppendXML);
    cmCTest::GenerateSubprojectsOutput((this->super_cmCTestGenericHandler).CTest,xml);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"Testing",(allocator<char> *)&local_88);
    cmXMLWriter::StartElement(xml,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"StartDateTime",(allocator<char> *)&local_88);
    cmXMLWriter::Element<std::__cxx11::string>(xml,&local_b8,&this->StartTest);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"StartTestTime",(allocator<char> *)&local_88);
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              (xml,&local_b8,&this->StartTestTime);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"TestList",(allocator<char> *)&local_88);
    cmXMLWriter::StartElement(xml,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    pcVar1 = (this->TestResults).
             super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_90 = this;
    for (pcVar6 = (this->TestResults).
                  super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
                  ._M_impl.super__Vector_impl_data._M_start; pcVar6 != pcVar1; pcVar6 = pcVar6 + 1)
    {
      std::operator+(&local_88,&pcVar6->Path,"/");
      std::operator+(&local_b8,&local_88,&pcVar6->Name);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"Test",&local_91);
      cmCTest::GetShortPathToFile_abi_cxx11_
                (&local_50,(local_90->super_cmCTestGenericHandler).CTest,local_b8._M_dataplus._M_p);
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_88,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    cmXMLWriter::EndElement(xml);
    local_68 = (local_90->TestResults).
               super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    pcVar6 = (local_90->TestResults).
             super__Vector_base<cmCTestTestHandler::cmCTestTestResult,_std::allocator<cmCTestTestHandler::cmCTestTestResult>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (pcVar6 != local_68) {
      WriteTestResultHeader(local_90,xml,pcVar6);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Results",(allocator<char> *)&local_88);
      cmXMLWriter::StartElement(xml,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      if (pcVar6->Status != 0) {
        if ((pcVar6->Status != 9) || (pcVar6->ReturnValue != 0)) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"NamedMeasurement",(allocator<char> *)&local_88);
          cmXMLWriter::StartElement(xml,&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
          cmXMLWriter::Attribute<char[10]>(xml,"name",(char (*) [10])"Exit Code");
          pcVar5 = (cmCTestTestHandler *)0x4562ae;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"Value",(allocator<char> *)&local_50);
          GetTestStatus_abi_cxx11_(&local_88,pcVar5,pcVar6);
          cmXMLWriter::Element<std::__cxx11::string>(xml,&local_b8,&local_88);
          std::__cxx11::string::~string((string *)&local_88);
          std::__cxx11::string::~string((string *)&local_b8);
          cmXMLWriter::EndElement(xml);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"NamedMeasurement",(allocator<char> *)&local_88);
          cmXMLWriter::StartElement(xml,&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
          cmXMLWriter::Attribute<char[11]>(xml,"name",(char (*) [11])"Exit Value");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"Value",(allocator<char> *)&local_88);
          cmXMLWriter::Element<long>(xml,&local_b8,&pcVar6->ReturnValue);
          std::__cxx11::string::~string((string *)&local_b8);
          cmXMLWriter::EndElement(xml);
        }
        GenerateRegressionImages(local_90,xml,&pcVar6->DartString);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"NamedMeasurement",(allocator<char> *)&local_88);
        cmXMLWriter::StartElement(xml,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        cmXMLWriter::Attribute<char[15]>(xml,"type",(char (*) [15])"numeric/double");
        cmXMLWriter::Attribute<char[15]>(xml,"name",(char (*) [15])"Execution Time");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"Value",(allocator<char> *)&local_50);
        local_88._M_dataplus._M_p = (pointer)(pcVar6->ExecutionTime).__r;
        cmXMLWriter::Element<double>(xml,&local_b8,(double *)&local_88);
        std::__cxx11::string::~string((string *)&local_b8);
        cmXMLWriter::EndElement(xml);
        if ((pcVar6->Reason)._M_string_length != 0) {
          pcVar2 = "Test Fail Reason";
          if (pcVar6->Status == 9) {
            pcVar2 = "Test Pass Reason";
          }
          local_88._M_dataplus._M_p = pcVar2 + 5;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"NamedMeasurement",(allocator<char> *)&local_50);
          cmXMLWriter::StartElement(xml,&local_b8);
          std::__cxx11::string::~string((string *)&local_b8);
          cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
          cmXMLWriter::Attribute<char_const*>(xml,"name",(char **)&local_88);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b8,"Value",(allocator<char> *)&local_50);
          cmXMLWriter::Element<std::__cxx11::string>(xml,&local_b8,&pcVar6->Reason);
          std::__cxx11::string::~string((string *)&local_b8);
          cmXMLWriter::EndElement(xml);
        }
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"NamedMeasurement",(allocator<char> *)&local_88);
      cmXMLWriter::StartElement(xml,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      cmXMLWriter::Attribute<char[15]>(xml,"type",(char (*) [15])"numeric/double");
      cmXMLWriter::Attribute<char[11]>(xml,"name",(char (*) [11])"Processors");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Value",(allocator<char> *)&local_88);
      cmXMLWriter::Element<int>(xml,&local_b8,&pcVar6->Properties->Processors);
      std::__cxx11::string::~string((string *)&local_b8);
      cmXMLWriter::EndElement(xml);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"NamedMeasurement",(allocator<char> *)&local_88);
      cmXMLWriter::StartElement(xml,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
      cmXMLWriter::Attribute<char[18]>(xml,"name",(char (*) [18])"Completion Status");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Value",(allocator<char> *)&local_88);
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_b8,&pcVar6->CompletionStatus);
      std::__cxx11::string::~string((string *)&local_b8);
      cmXMLWriter::EndElement(xml);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"NamedMeasurement",(allocator<char> *)&local_88);
      cmXMLWriter::StartElement(xml,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
      cmXMLWriter::Attribute<char[13]>(xml,"name",(char (*) [13])"Command Line");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Value",(allocator<char> *)&local_88);
      cmXMLWriter::Element<std::__cxx11::string>(xml,&local_b8,&pcVar6->FullCommandLine);
      std::__cxx11::string::~string((string *)&local_b8);
      cmXMLWriter::EndElement(xml);
      local_58 = &(pcVar6->Properties->Measurements)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_60 = pcVar6;
      for (p_Var4 = (pcVar6->Properties->Measurements)._M_t._M_impl.super__Rb_tree_header._M_header.
                    _M_left; result = local_60, p_Var4 != local_58;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"NamedMeasurement",(allocator<char> *)&local_88);
        cmXMLWriter::StartElement(xml,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (xml,"name",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1)
                  );
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"Value",(allocator<char> *)&local_88);
        cmXMLWriter::Element<std::__cxx11::string>
                  (xml,&local_b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 2)
                  );
        std::__cxx11::string::~string((string *)&local_b8);
        cmXMLWriter::EndElement(xml);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Measurement",(allocator<char> *)&local_88);
      cmXMLWriter::StartElement(xml,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"Value",(allocator<char> *)&local_88);
      cmXMLWriter::StartElement(xml,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      if (result->CompressOutput == true) {
        cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
        cmXMLWriter::Attribute<char[5]>(xml,"compression",(char (*) [5])0x4505f7);
      }
      cmXMLWriter::Content<std::__cxx11::string>(xml,&result->Output);
      cmXMLWriter::EndElement(xml);
      cmXMLWriter::EndElement(xml);
      cmXMLWriter::EndElement(xml);
      pcVar5 = local_90;
      AttachFiles(local_90,xml,result);
      WriteTestResultFooter(pcVar5,xml,result);
      pcVar6 = result + 1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"EndDateTime",(allocator<char> *)&local_88);
    pcVar5 = local_90;
    cmXMLWriter::Element<std::__cxx11::string>(xml,&local_b8,&local_90->EndTest);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"EndTestTime",(allocator<char> *)&local_88);
    cmXMLWriter::
    Element<std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>
              (xml,&local_b8,&pcVar5->EndTestTime);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"ElapsedMinutes",(allocator<char> *)&local_50);
    local_88._M_dataplus._M_p = (pointer)(long)((pcVar5->ElapsedTestingTime).__r / 60.0);
    cmXMLWriter::Element<long>(xml,&local_b8,(long *)&local_88);
    std::__cxx11::string::~string((string *)&local_b8);
    cmXMLWriter::EndElement(xml);
    cmCTest::EndXML((pcVar5->super_cmCTestGenericHandler).CTest,xml);
  }
  return;
}

Assistant:

void cmCTestTestHandler::GenerateDartOutput(cmXMLWriter& xml)
{
  if (!this->CTest->GetProduceXML()) {
    return;
  }

  this->CTest->StartXML(xml, this->AppendXML);
  this->CTest->GenerateSubprojectsOutput(xml);
  xml.StartElement("Testing");
  xml.Element("StartDateTime", this->StartTest);
  xml.Element("StartTestTime", this->StartTestTime);
  xml.StartElement("TestList");
  for (cmCTestTestResult const& result : this->TestResults) {
    std::string testPath = result.Path + "/" + result.Name;
    xml.Element("Test", this->CTest->GetShortPathToFile(testPath.c_str()));
  }
  xml.EndElement(); // TestList
  for (cmCTestTestResult& result : this->TestResults) {
    this->WriteTestResultHeader(xml, result);
    xml.StartElement("Results");

    if (result.Status != cmCTestTestHandler::NOT_RUN) {
      if (result.Status != cmCTestTestHandler::COMPLETED ||
          result.ReturnValue) {
        xml.StartElement("NamedMeasurement");
        xml.Attribute("type", "text/string");
        xml.Attribute("name", "Exit Code");
        xml.Element("Value", this->GetTestStatus(result));
        xml.EndElement(); // NamedMeasurement

        xml.StartElement("NamedMeasurement");
        xml.Attribute("type", "text/string");
        xml.Attribute("name", "Exit Value");
        xml.Element("Value", result.ReturnValue);
        xml.EndElement(); // NamedMeasurement
      }
      this->GenerateRegressionImages(xml, result.DartString);
      xml.StartElement("NamedMeasurement");
      xml.Attribute("type", "numeric/double");
      xml.Attribute("name", "Execution Time");
      xml.Element("Value", result.ExecutionTime.count());
      xml.EndElement(); // NamedMeasurement
      if (!result.Reason.empty()) {
        const char* reasonType = "Pass Reason";
        if (result.Status != cmCTestTestHandler::COMPLETED) {
          reasonType = "Fail Reason";
        }
        xml.StartElement("NamedMeasurement");
        xml.Attribute("type", "text/string");
        xml.Attribute("name", reasonType);
        xml.Element("Value", result.Reason);
        xml.EndElement(); // NamedMeasurement
      }
    }

    xml.StartElement("NamedMeasurement");
    xml.Attribute("type", "numeric/double");
    xml.Attribute("name", "Processors");
    xml.Element("Value", result.Properties->Processors);
    xml.EndElement(); // NamedMeasurement

    xml.StartElement("NamedMeasurement");
    xml.Attribute("type", "text/string");
    xml.Attribute("name", "Completion Status");
    xml.Element("Value", result.CompletionStatus);
    xml.EndElement(); // NamedMeasurement

    xml.StartElement("NamedMeasurement");
    xml.Attribute("type", "text/string");
    xml.Attribute("name", "Command Line");
    xml.Element("Value", result.FullCommandLine);
    xml.EndElement(); // NamedMeasurement
    for (auto const& measure : result.Properties->Measurements) {
      xml.StartElement("NamedMeasurement");
      xml.Attribute("type", "text/string");
      xml.Attribute("name", measure.first);
      xml.Element("Value", measure.second);
      xml.EndElement(); // NamedMeasurement
    }
    xml.StartElement("Measurement");
    xml.StartElement("Value");
    if (result.CompressOutput) {
      xml.Attribute("encoding", "base64");
      xml.Attribute("compression", "gzip");
    }
    xml.Content(result.Output);
    xml.EndElement(); // Value
    xml.EndElement(); // Measurement
    xml.EndElement(); // Results

    this->AttachFiles(xml, result);
    this->WriteTestResultFooter(xml, result);
  }

  xml.Element("EndDateTime", this->EndTest);
  xml.Element("EndTestTime", this->EndTestTime);
  xml.Element(
    "ElapsedMinutes",
    std::chrono::duration_cast<std::chrono::minutes>(this->ElapsedTestingTime)
      .count());
  xml.EndElement(); // Testing
  this->CTest->EndXML(xml);
}